

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QBitArray * performBitwiseOperationHelper<std::bit_or<unsigned_char>>(QBitArray *param_1)

{
  uchar uVar1;
  DataPtr *this;
  DataPtr *this_00;
  DataPtr *this_01;
  char *pcVar2;
  longlong *plVar3;
  long in_FS_OFFSET;
  qsizetype i_1;
  qsizetype i;
  uchar *dst;
  QByteArrayData *d2;
  QByteArrayData *d1;
  uchar *p2;
  uchar *p1;
  qsizetype n2;
  qsizetype n1;
  long local_80;
  long local_78;
  uchar local_39;
  longlong local_38;
  uchar *local_30;
  uchar *local_28;
  qsizetype local_20;
  qsizetype local_18;
  bit_or<unsigned_char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = QBitArray::data_ptr((QBitArray *)0x588d30);
  this_00 = QBitArray::data_ptr((QBitArray *)0x588d4e);
  local_18 = this->size;
  local_20 = this_00->size;
  this_01 = QBitArray::data_ptr((QBitArray *)0x588d79);
  pcVar2 = QArrayDataPointer<char>::data(this_01);
  local_28 = (uchar *)QArrayDataPointer<char>::data(this);
  local_30 = (uchar *)QArrayDataPointer<char>::data(this_00);
  if (local_18 < local_20) {
    std::swap<long_long>(&local_18,&local_20);
    std::swap<unsigned_char_const*>(&local_28,&local_30);
  }
  for (local_78 = 1; local_78 < local_20; local_78 = local_78 + 1) {
    uVar1 = std::bit_or<unsigned_char>::operator()(&local_9,local_28 + local_78,local_30 + local_78)
    ;
    pcVar2[local_78] = uVar1;
  }
  local_38 = 1;
  plVar3 = qMax<long_long>(&local_20,&local_38);
  for (local_80 = *plVar3; local_80 < local_18; local_80 = local_80 + 1) {
    local_39 = '\0';
    uVar1 = std::bit_or<unsigned_char>::operator()(&local_9,local_28 + local_80,&local_39);
    pcVar2[local_80] = uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return param_1;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static
QBitArray &performBitwiseOperationHelper(QBitArray &out, const QBitArray &a1,
                                         const QBitArray &a2, BitwiseOp op)
{
    const QByteArrayData &d1 = a1.data_ptr();
    const QByteArrayData &d2 = a2.data_ptr();

    // Sizes in bytes (including the initial bit difference counter)
    qsizetype n1 = d1.size;
    qsizetype n2 = d2.size;
    Q_ASSERT(out.data_ptr().size == qMax(n1, n2));
    Q_ASSERT(out.data_ptr().size == 0 || !out.data_ptr().needsDetach());

    // Bypass QByteArray's emptiness verification; we won't dereference
    // these pointers if their size is zero.
    auto dst = reinterpret_cast<uchar *>(out.data_ptr().data());
    auto p1 = reinterpret_cast<const uchar *>(d1.data());
    auto p2 = reinterpret_cast<const uchar *>(d2.data());

    // Main: perform the operation in the range where both arrays have data
    if (n1 < n2) {
        std::swap(n1, n2);
        std::swap(p1, p2);
    }
    for (qsizetype i = 1; i < n2; ++i)
        dst[i] = op(p1[i], p2[i]);

    // Tail: operate as if both arrays had the same data by padding zeroes to
    // the end of the shorter of the two (for std::bit_or and std::bit_xor, this is
    // a memmove; for std::bit_and, it's memset to 0).
    for (qsizetype i = qMax(n2, qsizetype(1)); i < n1; ++i)
        dst[i] = op(p1[i], uchar(0));

    return out;
}